

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

bool __thiscall QExceptionNotifier::event(QExceptionNotifier *this,QEvent *e)

{
  byte bVar1;
  Type TVar2;
  SocketState SVar3;
  QEvent *in_RSI;
  QEvent *in_RDI;
  undefined1 local_1;
  
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == SockAct) {
    SVar3 = QAbstractSocketEngine::state((QAbstractSocketEngine *)0x261029);
    if (SVar3 == ConnectingState) {
      QNativeSocketEngine::connectionNotification((QNativeSocketEngine *)in_RDI);
    }
    else {
      QAbstractSocketEngine::exceptionNotification((QAbstractSocketEngine *)in_RDI);
    }
    local_1 = true;
  }
  else {
    bVar1 = QSocketNotifier::event(in_RDI);
    local_1 = (bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

bool QExceptionNotifier::event(QEvent *e)
{
    if (e->type() == QEvent::SockAct) {
        if (engine->state() == QAbstractSocket::ConnectingState)
            engine->connectionNotification();
        else
            engine->exceptionNotification();
        return true;
    }
    return QSocketNotifier::event(e);
}